

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign<float>
          (CImg<unsigned_int> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint *puVar1;
  float fVar2;
  uint *puVar3;
  CImg<unsigned_int> *pCVar4;
  
  if ((values != (float *)0x0) &&
     ((ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x != 0)) {
    assign(this,size_x,size_y,size_z,size_c);
    puVar3 = this->_data;
    puVar1 = puVar3 + (ulong)this->_spectrum * (ulong)this->_depth *
                      (ulong)this->_height * (ulong)this->_width;
    for (; puVar3 < puVar1; puVar3 = puVar3 + 1) {
      fVar2 = *values;
      values = values + 1;
      *puVar3 = (uint)(long)fVar2;
    }
    return this;
  }
  pCVar4 = assign(this);
  return pCVar4;
}

Assistant:

CImg<T>& assign(const t *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      assign(size_x,size_y,size_z,size_c);
      const t *ptrs = values; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      return *this;
    }